

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

double cupdlp_dcs_norm(cupdlp_dcs *A)

{
  double local_48;
  double s;
  double nrm;
  double *Ax;
  int *Ap;
  int n;
  int j;
  int p;
  cupdlp_dcs *A_local;
  double local_8;
  
  nrm = 0.0;
  if (((A == (cupdlp_dcs *)0x0) || (A->nz != -1)) || (A->x == (double *)0x0)) {
    local_8 = -1.0;
  }
  else {
    for (j = 0; j < A->n; j = j + 1) {
      s = 0.0;
      for (p = A->p[j]; p < A->p[j + 1]; p = p + 1) {
        s = ABS(A->x[p]) + s;
      }
      if (nrm <= s) {
        local_48 = s;
      }
      else {
        local_48 = nrm;
      }
      nrm = local_48;
    }
    local_8 = nrm;
  }
  return local_8;
}

Assistant:

double cupdlp_dcs_norm(const cupdlp_dcs *A) {
  int p, j, n, *Ap;
  double *Ax;
  double nrm = 0, s;
  if (!IS_CSC(A) || !A->x) return (-1); /* check inputs */
  n = A->n;
  Ap = A->p;
  Ax = A->x;
  for (j = 0; j < n; j++) {
    for (s = 0, p = Ap[j]; p < Ap[j + 1]; p++) s += fabs(Ax[p]);
    nrm = MAX(nrm, s);
  }
  return (nrm);
}